

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenStartSeqBubble(HdmiCecAnalyzerResults *this)

{
  allocator local_29;
  string local_28;
  
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&local_28,"S",&local_29);
    AddResult(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"Start",&local_29);
    AddResult(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string((string *)&local_28,"Start Seq.",&local_29);
    AddResult(this,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  std::__cxx11::string::string((string *)&local_28,"Start Sequence",&local_29);
  AddResult(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenStartSeqBubble()
{
    if( !mTabular )
    {
        AddResult( "S" );
        AddResult( "Start" );
        AddResult( "Start Seq." );
    }
    AddResult( "Start Sequence" );
}